

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall
GdlExpression::TypeCheck
          (GdlExpression *this,
          vector<ExpressionType,_std::allocator<ExpressionType>_> *vexptExpected)

{
  ExpressionType EVar1;
  pointer pEVar2;
  bool bVar3;
  int iVar4;
  size_t i;
  long lVar5;
  bool bVar6;
  ExpressionType exptFound;
  ExpressionType local_c;
  
  iVar4 = (*this->_vptr_GdlExpression[10])(this,&local_c);
  if ((char)iVar4 == '\0') {
    bVar3 = false;
  }
  else {
    pEVar2 = (vexptExpected->super__Vector_base<ExpressionType,_std::allocator<ExpressionType>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      bVar6 = (long)(vexptExpected->
                    super__Vector_base<ExpressionType,_std::allocator<ExpressionType>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pEVar2 >> 2 == lVar5;
      bVar3 = !bVar6;
      if (bVar6) {
        return bVar3;
      }
      EVar1 = pEVar2[lVar5];
      if (EVar1 == kexptUnknown) {
        return bVar3;
      }
      if (EVar1 == local_c) {
        return bVar3;
      }
      lVar5 = lVar5 + 1;
    } while (4 < EVar1 - kexptNumber || (local_c & ~kexptNumber) != kexptZero);
  }
  return bVar3;
}

Assistant:

bool GdlExpression::TypeCheck(std::vector<ExpressionType>& vexptExpected)
{
	ExpressionType exptFound;
	if (!CheckTypeAndUnits(&exptFound))
		return false;

	for (size_t i = 0; i < vexptExpected.size(); ++i)
	{
		ExpressionType exptOkay = vexptExpected[i];
		if (exptOkay == exptFound)
			return true;
		if (exptOkay == kexptUnknown)
			return true;
		if ((exptFound == kexptZero || exptFound == kexptOne) &&
			(exptOkay == kexptMeas || exptOkay == kexptNumber || exptOkay == kexptBoolean ||
				exptOkay == kexptZero || exptOkay == kexptOne))
		{
			return true;
		}
	}
	
	return false;
}